

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

SubMeshXml * __thiscall Assimp::Ogre::MeshXml::GetSubMesh(MeshXml *this,uint16_t index)

{
  size_type sVar1;
  const_reference ppSVar2;
  ulong local_28;
  size_t i;
  uint16_t index_local;
  MeshXml *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::
            size(&this->subMeshes);
    if (sVar1 <= local_28) {
      return (SubMeshXml *)0x0;
    }
    ppSVar2 = std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::
              operator[](&this->subMeshes,local_28);
    if (((*ppSVar2)->super_ISubMesh).index == (uint)index) break;
    local_28 = local_28 + 1;
  }
  ppSVar2 = std::vector<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>::
            operator[](&this->subMeshes,local_28);
  return *ppSVar2;
}

Assistant:

SubMeshXml *MeshXml::GetSubMesh(uint16_t index) const
{
    for(size_t i=0; i<subMeshes.size(); ++i)
        if (subMeshes[i]->index == index)
            return subMeshes[i];
    return 0;
}